

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

char * c_escape(char *str,curl_off_t len)

{
  bool bVar1;
  char *pcVar2;
  char *p;
  dynbuf escaped;
  CURLcode result;
  uint cutoff;
  char *s;
  curl_off_t len_local;
  char *str_local;
  
  escaped.toobig._4_4_ = 0;
  curlx_dyn_init((dynbuf *)&p,0x1f43);
  s = (char *)len;
  if (len == -1) {
    s = (char *)strlen(str);
  }
  if (2000 < (long)s) {
    s = (char *)0x7d0;
    escaped.toobig._4_4_ = 3;
  }
  escaped.toobig._0_4_ = curlx_dyn_addn((dynbuf *)&p,"",0);
  _result = (byte *)str;
  len_local = (curl_off_t)str;
  for (; (CURLcode)escaped.toobig == CURLE_OK && s != (char *)0x0; s = s + -1) {
    pcVar2 = strchr("\t\r\n?\"\\",(int)(char)*_result);
    if ((pcVar2 != (char *)0x0) ||
       ((((char)*_result < '\t' || ('\r' < (char)*_result)) &&
        (((char)*_result < ' ' || ('~' < (char)*_result)))))) {
      escaped.toobig._0_4_ =
           curlx_dyn_addn((dynbuf *)&p,(void *)len_local,(long)_result - len_local);
      len_local = (curl_off_t)(_result + 1);
      if ((CURLcode)escaped.toobig == CURLE_OK) {
        if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
          bVar1 = false;
          if ((((1 < (long)s) &&
               (((char)_result[1] < '0' || (bVar1 = true, '9' < (char)_result[1])))) &&
              (((char)_result[1] < 'a' || (bVar1 = true, 'f' < (char)_result[1])))) &&
             (bVar1 = false, '@' < (char)_result[1])) {
            bVar1 = (char)_result[1] < 'G';
          }
          pcVar2 = "\\x%02x";
          if (bVar1) {
            pcVar2 = "\\%03o";
          }
          escaped.toobig._0_4_ = curlx_dyn_addf((dynbuf *)&p,pcVar2,(ulong)*_result);
        }
        else {
          escaped.toobig._0_4_ =
               curlx_dyn_addn((dynbuf *)&p,"\\t\\r\\n\\?\\\"\\\\" + (long)(pcVar2 + -0x134ee8) * 2,2
                             );
        }
      }
    }
    _result = _result + 1;
  }
  if ((CURLcode)escaped.toobig == CURLE_OK) {
    escaped.toobig._0_4_ = curlx_dyn_addn((dynbuf *)&p,(void *)len_local,(long)_result - len_local);
  }
  if ((CURLcode)escaped.toobig == CURLE_OK) {
    curlx_dyn_addn((dynbuf *)&p,"...",(ulong)escaped.toobig._4_4_);
  }
  pcVar2 = curlx_dyn_ptr((dynbuf *)&p);
  return pcVar2;
}

Assistant:

static char *c_escape(const char *str, curl_off_t len)
{
  const char *s;
  unsigned int cutoff = 0;
  CURLcode result;
  struct curlx_dynbuf escaped;

  curlx_dyn_init(&escaped, 4 * MAX_STRING_LENGTH_OUTPUT + 3);

  if(len == ZERO_TERMINATED)
    len = strlen(str);

  if(len > MAX_STRING_LENGTH_OUTPUT) {
    /* cap ridiculously long strings */
    len = MAX_STRING_LENGTH_OUTPUT;
    cutoff = 3;
  }

  result = curlx_dyn_addn(&escaped, STRCONST(""));
  for(s = str; !result && len; s++, len--) {
    /* escape question marks as well, to prevent generating accidental
       trigraphs */
    static const char from[] = "\t\r\n?\"\\";
    static const char to[] = "\\t\\r\\n\\?\\\"\\\\";
    const char *p = strchr(from, *s);

    if(!p && ISPRINT(*s))
      continue;

    result = curlx_dyn_addn(&escaped, str, s - str);
    str = s + 1;

    if(!result) {
      if(p && *p)
        result = curlx_dyn_addn(&escaped, to + 2 * (p - from), 2);
      else {
        result = curlx_dyn_addf(&escaped,
                                /* Octal escape to avoid >2 digit hex. */
                                (len > 1 && ISXDIGIT(s[1])) ?
                                  "\\%03o" : "\\x%02x",
                                (unsigned int) *(const unsigned char *) s);
      }
    }
  }

  if(!result)
    result = curlx_dyn_addn(&escaped, str, s - str);

  if(!result)
    (void) !curlx_dyn_addn(&escaped, "...", cutoff);

  return curlx_dyn_ptr(&escaped);
}